

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class1_test_matching.cc
# Opt level: O3

Ptr visualize_matching(Result *matching,Ptr *image1,Ptr *image2,
                      vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *pos1
                      ,vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                       *pos2)

{
  pointer pVVar1;
  double dVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ostream *poVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long *in_R9;
  ulong uVar8;
  Ptr PVar9;
  undefined1 auStack_a0 [8];
  Correspondence2D2D match;
  Ptr *match_image;
  ConstPtr local_68;
  ConstPtr local_58;
  undefined1 auStack_48 [8];
  Correspondences2D2D vis_matches;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  
  auStack_48 = (undefined1  [8])0x0;
  vis_matches.super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vis_matches.super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var5 = (image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  match.p2[1] = (double)matching;
  if (p_Var5 != p_Var3) {
    uVar8 = 0;
    do {
      lVar6 = (long)*(int *)((long)&(((TypedImageBase<unsigned_char> *)
                                     &p_Var3->_vptr__Sp_counted_base)->super_ImageBase).
                                    _vptr_ImageBase + uVar8 * 4);
      if (-1 < lVar6) {
        pVVar1 = (pos2->
                 super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        auStack_a0 = (undefined1  [8])(double)pVVar1[uVar8].v[0];
        match.p1[0] = (double)pVVar1[uVar8].v[1];
        match.p1[1] = (double)*(float *)(*in_R9 + lVar6 * 8);
        match.p2[0] = (double)*(float *)(*in_R9 + 4 + lVar6 * 8);
        if (vis_matches.
            super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            vis_matches.
            super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::vector<sfm::Correspondence2D2D,std::allocator<sfm::Correspondence2D2D>>::
          _M_realloc_insert<sfm::Correspondence2D2D_const&>
                    ((vector<sfm::Correspondence2D2D,std::allocator<sfm::Correspondence2D2D>> *)
                     auStack_48,
                     (iterator)
                     vis_matches.
                     super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>
                     ._M_impl.super__Vector_impl_data._M_start,(Correspondence2D2D *)auStack_a0);
        }
        else {
          (vis_matches.
           super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>.
           _M_impl.super__Vector_impl_data._M_start)->p2[0] = match.p1[1];
          (vis_matches.
           super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>.
           _M_impl.super__Vector_impl_data._M_start)->p2[1] = match.p2[0];
          (vis_matches.
           super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>.
           _M_impl.super__Vector_impl_data._M_start)->p1[0] = (double)auStack_a0;
          (vis_matches.
           super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>.
           _M_impl.super__Vector_impl_data._M_start)->p1[1] = match.p1[0];
          vis_matches.
          super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>.
          _M_impl.super__Vector_impl_data._M_start =
               vis_matches.
               super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        p_Var5 = (image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)p_Var5 - (long)p_Var3 >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Drawing ",8);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," matches...",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  dVar2 = match.p2[1];
  local_68.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_68.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_68.
            super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_68.
            super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_58.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (pos1->super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_58.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (pos1->super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (local_58.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.
            super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.
            super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  PVar9 = features::Visualizer::draw_matches
                    ((Visualizer *)match.p2[1],&local_68,&local_58,(Correspondences2D2D *)auStack_48
                    );
  _Var7 = PVar9.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_58.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var7._M_pi = extraout_RDX;
  }
  if (local_68.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var7._M_pi = extraout_RDX_00;
  }
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48);
    _Var7._M_pi = extraout_RDX_01;
  }
  PVar9.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var7._M_pi;
  PVar9.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar2;
  return (Ptr)PVar9.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

core::ByteImage::Ptr
visualize_matching (features::Matching::Result const& matching,
    core::ByteImage::Ptr image1, core::ByteImage::Ptr image2,
    std::vector<math::Vec2f> const& pos1, std::vector<math::Vec2f> const& pos2)
{
    /* Visualize keypoints. */
    sfm::Correspondences2D2D vis_matches;
    for (std::size_t i = 0; i < matching.matches_1_2.size(); ++i)
    {
        if (matching.matches_1_2[i] < 0)
            continue;
        int const j = matching.matches_1_2[i];

        sfm::Correspondence2D2D match;
        std::copy(pos1[i].begin(), pos1[i].end(), match.p1);
        std::copy(pos2[j].begin(), pos2[j].end(), match.p2);
        vis_matches.push_back(match);
    }

    std::cout << "Drawing " << vis_matches.size() << " matches..." << std::endl;
    core::ByteImage::Ptr match_image = sfm::Visualizer::draw_matches
        (image1, image2, vis_matches);
    return match_image;
}